

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDToBrepParameters::CompareFromPointers
              (ON_SubDToBrepParameters *lhs,ON_SubDToBrepParameters *rhs)

{
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDToBrepParameters *)0x0) {
    return 1;
  }
  if (rhs != (ON_SubDToBrepParameters *)0x0) {
    if (rhs->m_bPackFaces <= lhs->m_bPackFaces) {
      if (rhs->m_bPackFaces < lhs->m_bPackFaces) {
        return 1;
      }
      if (lhs->m_extraordinary_vertex_process < rhs->m_extraordinary_vertex_process) {
        return -1;
      }
      return (uint)(rhs->m_extraordinary_vertex_process < lhs->m_extraordinary_vertex_process);
    }
  }
  return -1;
}

Assistant:

int ON_SubDToBrepParameters::CompareFromPointers(
  const ON_SubDToBrepParameters* lhs,
  const ON_SubDToBrepParameters* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_SubDToBrepParameters::Compare(*lhs, *rhs);
}